

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O0

Error __thiscall
asmjit::X86Compiler::_emit
          (X86Compiler *this,uint32_t instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *o3,
          Operand_ *o4,Operand_ *o5)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ushort uVar5;
  Error EVar6;
  int iVar7;
  CodeBuilder *pCVar8;
  anon_union_8_2_78723da6_for_MemData_2 *paVar9;
  Zone *this_00;
  undefined4 extraout_var;
  undefined8 *puVar10;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *paVar11;
  undefined4 extraout_var_00;
  uint uVar12;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *in_RCX;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *in_RDX;
  uint in_ESI;
  size_t in_RDI;
  uint *in_R8;
  uint *in_R9;
  uint *in_stack_00000008;
  uint *in_stack_00000010;
  Operand *opArray_3;
  CBInst *node_1;
  Error err_1;
  CBLabel *jTarget;
  Operand *opArray_1;
  CBJump *node;
  StringBuilderTmp<256UL> sb;
  Error err;
  Detail instDetail;
  Operand opArray [6];
  uint32_t kErrorsAndSpecialCases;
  uint32_t opCount;
  char *inlineComment;
  uint32_t options;
  uint32_t i_1;
  uint32_t opCount_2;
  Operand *opArray_4;
  uint32_t i;
  uint32_t opCount_1;
  Operand *opArray_2;
  size_t allocatedSize_1;
  size_t allocatedSize;
  undefined4 in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff74c;
  undefined4 in_stack_fffffffffffff750;
  Error in_stack_fffffffffffff754;
  CBNode *in_stack_fffffffffffff758;
  CodeBuilder *in_stack_fffffffffffff760;
  CodeEmitter *in_stack_fffffffffffff768;
  StringBuilder *in_stack_fffffffffffff770;
  StringBuilder *in_stack_fffffffffffff778;
  undefined8 *puVar13;
  uint32_t in_stack_fffffffffffff780;
  undefined8 in_stack_fffffffffffff790;
  uint32_t id;
  CBLabel **in_stack_fffffffffffff798;
  CodeBuilder *pCVar14;
  bool local_836;
  undefined4 in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7dc;
  ZoneHeap *in_stack_fffffffffffff7e8;
  undefined1 *local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined1 local_7b8 [268];
  Error local_6ac;
  undefined1 local_6a8 [4];
  uint local_6a4;
  undefined8 local_6a0;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 local_698;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 local_690;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 local_688;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined4 local_638;
  uint local_634;
  CodeBuilder *local_630;
  uint local_624;
  uint *local_620;
  uint *local_618;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_610;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_608;
  uint local_5fc;
  Error local_5ec;
  undefined4 local_5e8;
  undefined4 local_5e4;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_590;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_580;
  undefined8 *local_570;
  undefined8 *local_560;
  undefined8 *local_550;
  undefined8 *local_540;
  undefined8 *local_538;
  uint local_530;
  undefined1 *local_528;
  undefined1 **local_510;
  undefined8 local_508;
  char *local_500;
  undefined1 **local_4f8;
  undefined8 local_4f0;
  char *local_4e8;
  undefined1 **local_4e0;
  undefined1 **local_4d8;
  undefined4 in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  char *in_stack_fffffffffffffb50;
  uint local_128;
  uint local_110;
  
  id = (uint32_t)((ulong)in_stack_fffffffffffff790 >> 0x20);
  iVar7 = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  local_624 = *(uint *)(in_RDI + 0x3c) | *(uint *)(in_RDI + 0x38);
  local_630 = *(CodeBuilder **)(in_RDI + 0x48);
  local_634 = (uint)(((in_RDX->offsetLo32 & 7) == 0 ^ 0xffU) & 1) +
              (uint)(((in_RCX->offsetLo32 & 7) == 0 ^ 0xffU) & 1) +
              (uint)(((*in_R8 & 7) == 0 ^ 0xffU) & 1) + (uint)(((*in_R9 & 7) == 0 ^ 0xffU) & 1);
  if ((*in_stack_00000008 & 7) != 0) {
    local_634 = 5;
  }
  if ((*in_stack_00000010 & 7) != 0) {
    local_634 = 6;
  }
  local_638 = 3;
  local_620 = in_R9;
  local_618 = in_R8;
  local_610 = in_RCX;
  local_608 = in_RDX;
  local_5fc = in_ESI;
  if ((local_624 & 3) != 0) {
    if (*(int *)(in_RDI + 0x2c) != 0) {
      return *(Error *)(in_RDI + 0x2c);
    }
    if ((local_624 & 2) != 0) {
      local_590 = &local_698;
      local_698 = *in_RDX;
      local_690 = in_RDX[1];
      local_580 = &local_688;
      local_688 = *in_RCX;
      local_680 = in_RCX[1];
      local_570 = &local_678;
      local_678 = *(undefined8 *)in_R8;
      local_670 = *(undefined8 *)(in_R8 + 2);
      local_560 = &local_668;
      local_668 = *(undefined8 *)in_R9;
      local_660 = *(undefined8 *)(in_R9 + 2);
      local_550 = &local_658;
      local_658 = *(undefined8 *)in_stack_00000008;
      local_650 = *(undefined8 *)(in_stack_00000008 + 2);
      local_540 = &local_648;
      local_648 = *(undefined8 *)in_stack_00000010;
      local_640 = *(undefined8 *)(in_stack_00000010 + 2);
      local_538 = (undefined8 *)(in_RDI + 0x40);
      local_528 = local_6a8;
      local_6a0 = *local_538;
      local_530 = local_624;
      local_6a4 = local_624;
      local_6ac = Inst::validate((uint32_t)in_stack_fffffffffffff758,
                                 (Detail *)
                                 CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                                 (Operand_ *)
                                 CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),0);
      if (local_6ac != 0) {
        local_7d8 = local_7b8;
        local_7b8[0] = 0;
        local_7d0 = 0;
        local_7c8 = 0x100;
        local_7c0 = 0;
        local_510 = &local_7d8;
        local_4e8 = DebugUtils::errorAsString(in_stack_fffffffffffff754);
        local_4f0 = 0xffffffffffffffff;
        local_4e0 = &local_7d8;
        StringBuilder::_opString
                  (in_stack_fffffffffffff778,(uint32_t)((ulong)in_stack_fffffffffffff770 >> 0x20),
                   (char *)in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
        local_500 = ": ";
        local_508 = 0xffffffffffffffff;
        local_4f8 = &local_7d8;
        StringBuilder::_opString
                  (in_stack_fffffffffffff778,(uint32_t)((ulong)in_stack_fffffffffffff770 >> 0x20),
                   (char *)in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
        Logging::formatInstruction
                  (in_stack_fffffffffffff770,(uint32_t)((ulong)in_stack_fffffffffffff768 >> 0x20),
                   &in_stack_fffffffffffff760->super_CodeEmitter,
                   (uint32_t)((ulong)in_stack_fffffffffffff758 >> 0x20),
                   (Detail *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                   (Operand_ *)CONCAT44(in_stack_fffffffffffff74c,local_634),
                   in_stack_fffffffffffff780);
        local_4d8 = &local_7d8;
        local_5ec = CodeEmitter::setLastError
                              (in_stack_fffffffffffff768,
                               (Error)((ulong)in_stack_fffffffffffff760 >> 0x20),
                               (char *)in_stack_fffffffffffff758);
        StringBuilderTmp<256UL>::~StringBuilderTmp((StringBuilderTmp<256UL> *)0x222e4d);
        return local_5ec;
      }
      local_624 = local_624 & 0xfffffffd;
      local_6ac = 0;
    }
  }
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  if ((local_5fc < 0x113) || (local_836 = true, 0x132 < local_5fc)) {
    local_836 = 0x175 < local_5fc && local_5fc < 0x179;
  }
  if (local_836) {
    if (*(long *)(in_RDI + 0xd8) == 0) {
      DebugUtils::assertionFailed
                ((char *)(in_RDI + 0xd8),(int)((ulong)local_634 * 0x10 + 0x58 >> 0x20),
                 (char *)CONCAT44(local_5fc,in_stack_fffffffffffffb40));
    }
    pCVar8 = (CodeBuilder *)
             ZoneHeap::_alloc(in_stack_fffffffffffff7e8,in_RDI,
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
    uVar12 = local_5fc;
    uVar4 = local_624;
    uVar3 = local_634;
    paVar9 = &(pCVar8->super_CodeEmitter)._none.field_0._mem.field_2;
    if (pCVar8 == (CodeBuilder *)0x0) {
      local_5e4 = 1;
      local_5ec = CodeEmitter::setLastError
                            (in_stack_fffffffffffff768,
                             (Error)((ulong)in_stack_fffffffffffff760 >> 0x20),
                             (char *)in_stack_fffffffffffff758);
    }
    else {
      if (local_634 != 0) {
        paVar9->field_1 = *local_608;
        (pCVar8->super_CodeEmitter)._nativeGpReg.super_Operand.super_Operand_.field_0._packed[0] =
             *(UInt64 *)(local_608 + 1);
      }
      if (1 < local_634) {
        (pCVar8->super_CodeEmitter)._nativeGpReg.super_Operand.super_Operand_.field_0._mem.field_2.
        field_1 = *local_610;
        (pCVar8->super_CodeEmitter)._nativeGpArray = (Reg *)local_610[1];
      }
      if (2 < local_634) {
        (pCVar8->_cbBaseZone)._ptr = *(uint8_t **)local_618;
        (pCVar8->_cbBaseZone)._end = *(uint8_t **)(local_618 + 2);
      }
      if (3 < local_634) {
        (pCVar8->_cbBaseZone)._block = *(Block **)local_620;
        uVar2 = local_620[3];
        (pCVar8->_cbBaseZone)._blockSize = local_620[2];
        (pCVar8->_cbBaseZone)._blockAlignmentShift = uVar2;
      }
      if (4 < local_634) {
        (pCVar8->_cbDataZone)._ptr = *(uint8_t **)in_stack_00000008;
        (pCVar8->_cbDataZone)._end = *(uint8_t **)(in_stack_00000008 + 2);
      }
      if (5 < local_634) {
        (pCVar8->_cbDataZone)._block = *(Block **)in_stack_00000010;
        uVar2 = in_stack_00000010[3];
        (pCVar8->_cbDataZone)._blockSize = in_stack_00000010[2];
        (pCVar8->_cbDataZone)._blockAlignmentShift = uVar2;
      }
      (pCVar8->super_CodeEmitter)._vptr_CodeEmitter = (_func_int **)0x0;
      (pCVar8->super_CodeEmitter)._codeInfo._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
      (pCVar8->super_CodeEmitter)._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
      *(undefined1 *)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress = 1;
      *(undefined1 *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 1) = 0;
      *(short *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) =
           (short)*(undefined4 *)(in_RDI + 0x184);
      *(undefined4 *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 4) =
           *(undefined4 *)(in_RDI + 0x180);
      (pCVar8->super_CodeEmitter)._code = (CodeHolder *)0x0;
      (pCVar8->super_CodeEmitter)._nextEmitter = (CodeEmitter *)0x0;
      (pCVar8->super_CodeEmitter)._type = '\0';
      (pCVar8->super_CodeEmitter)._destroyed = '\0';
      (pCVar8->super_CodeEmitter)._finalized = '\0';
      (pCVar8->super_CodeEmitter)._reserved = '\0';
      (pCVar8->super_CodeEmitter)._lastError = 0;
      pCVar14 = pCVar8;
      memset(&(pCVar8->super_CodeEmitter)._privateData,0,8);
      *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) =
           *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) | 4;
      uVar12 = uVar12 & 0xffff;
      (pCVar8->super_CodeEmitter)._type = (char)uVar12;
      (pCVar8->super_CodeEmitter)._destroyed = (char)(uVar12 >> 8);
      (pCVar8->super_CodeEmitter)._finalized = (char)(uVar12 >> 0x10);
      (pCVar8->super_CodeEmitter)._reserved = (char)(uVar12 >> 0x18);
      (pCVar8->super_CodeEmitter)._lastError = uVar4;
      *(char *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 1) = (char)uVar3;
      (pCVar8->super_CodeEmitter)._extraReg = (RegOnly)paVar9;
      for (local_110 = 0;
          local_110 < *(byte *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 1);
          local_110 = local_110 + 1) {
        if ((*(uint *)((long)(pCVar8->super_CodeEmitter)._extraReg + (ulong)local_110 * 0x10) & 7)
            == 2) goto LAB_002234e4;
      }
      local_110 = 0xff;
LAB_002234e4:
      *(char *)&(pCVar8->super_CodeEmitter)._globalOptions = (char)local_110;
      (pCVar14->super_CodeEmitter)._inlineComment = (char *)0x0;
      (pCVar14->super_CodeEmitter)._none.field_0._packed[0] = (UInt64)0x0;
      uVar1 = *(undefined8 *)(in_RDI + 0x40);
      (pCVar8->super_CodeEmitter)._privateData = (int)uVar1;
      (pCVar8->super_CodeEmitter)._globalHints = (int)((ulong)uVar1 >> 0x20);
      *(undefined4 *)(in_RDI + 0x40) = 0;
      *(undefined4 *)(in_RDI + 0x44) = 0;
      if ((local_624 & 0x10) == 0) {
        if (((paVar9->field_1).offsetLo32 & 7) == 4) {
          EVar6 = CodeBuilder::getCBLabel(pCVar14,in_stack_fffffffffffff798,id);
          if (EVar6 != 0) {
            EVar6 = CodeEmitter::setLastError
                              (in_stack_fffffffffffff768,
                               (Error)((ulong)in_stack_fffffffffffff760 >> 0x20),
                               (char *)in_stack_fffffffffffff758);
            return EVar6;
          }
        }
        else {
          local_624 = local_624 | 0x10;
        }
      }
      (pCVar8->super_CodeEmitter)._lastError = local_624;
      uVar5 = 0x20;
      if (local_5fc == 0x11e) {
        uVar5 = 0x50;
      }
      *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) =
           *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) | uVar5;
      (pCVar8->super_CodeEmitter)._inlineComment = (char *)0x0;
      (pCVar8->super_CodeEmitter)._none.field_0._packed[0] = (UInt64)0x0;
      if (local_5fc == 0x11e) {
        *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) =
             *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) | 0x40;
      }
      else if ((local_624 & 0x100) != 0) {
        *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) =
             *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) | 0x40;
      }
      if (local_630 != (CodeBuilder *)0x0) {
        this_00 = (Zone *)(in_RDI + 0x98);
        pCVar14 = local_630;
        strlen((char *)local_630);
        iVar7 = Zone::dup(this_00,(int)pCVar14);
        local_630 = (CodeBuilder *)CONCAT44(extraout_var,iVar7);
        (pCVar8->super_CodeEmitter)._code = (CodeHolder *)local_630;
      }
      CodeBuilder::addNode(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
      local_5ec = 0;
    }
  }
  else {
    if (*(long *)(in_RDI + 0xd8) == 0) {
      DebugUtils::assertionFailed
                (in_stack_fffffffffffffb50,iVar7,
                 (char *)CONCAT44(local_5fc,in_stack_fffffffffffffb40));
    }
    puVar10 = (undefined8 *)
              ZoneHeap::_alloc(in_stack_fffffffffffff7e8,in_RDI,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
    uVar4 = local_624;
    uVar3 = local_634;
    paVar11 = (anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *)(puVar10 + 9);
    if (puVar10 == (undefined8 *)0x0) {
      local_5e8 = 1;
      local_5ec = CodeEmitter::setLastError
                            (in_stack_fffffffffffff768,
                             (Error)((ulong)in_stack_fffffffffffff760 >> 0x20),
                             (char *)in_stack_fffffffffffff758);
    }
    else {
      if (local_634 != 0) {
        *paVar11 = *local_608;
        *(anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *)(puVar10 + 10) =
             local_608[1];
      }
      if (1 < local_634) {
        *(anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *)(puVar10 + 0xb) =
             *local_610;
        *(anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *)(puVar10 + 0xc) =
             local_610[1];
      }
      if (2 < local_634) {
        puVar10[0xd] = *(undefined8 *)local_618;
        puVar10[0xe] = *(undefined8 *)(local_618 + 2);
      }
      if (3 < local_634) {
        puVar10[0xf] = *(undefined8 *)local_620;
        puVar10[0x10] = *(undefined8 *)(local_620 + 2);
      }
      if (4 < local_634) {
        puVar10[0x11] = *(undefined8 *)in_stack_00000008;
        puVar10[0x12] = *(undefined8 *)(in_stack_00000008 + 2);
      }
      if (5 < local_634) {
        puVar10[0x13] = *(undefined8 *)in_stack_00000010;
        puVar10[0x14] = *(undefined8 *)(in_stack_00000010 + 2);
      }
      *puVar10 = 0;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 1;
      *(undefined1 *)((long)puVar10 + 0x11) = 0;
      *(short *)((long)puVar10 + 0x12) = (short)*(undefined4 *)(in_RDI + 0x184);
      *(undefined4 *)((long)puVar10 + 0x14) = *(undefined4 *)(in_RDI + 0x180);
      puVar10[3] = 0;
      puVar10[4] = 0;
      *(undefined4 *)(puVar10 + 5) = 0;
      *(undefined4 *)((long)puVar10 + 0x2c) = 0;
      puVar13 = puVar10;
      memset(puVar10 + 6,0,8);
      *(ushort *)((long)puVar13 + 0x12) = *(ushort *)((long)puVar13 + 0x12) | 4;
      *(uint *)(puVar13 + 5) = local_5fc & 0xffff;
      *(uint *)((long)puVar13 + 0x2c) = uVar4;
      *(char *)((long)puVar13 + 0x11) = (char)uVar3;
      puVar13[8] = paVar11;
      for (local_128 = 0; local_128 < *(byte *)((long)puVar13 + 0x11); local_128 = local_128 + 1) {
        if ((*(uint *)(puVar13[8] + (ulong)local_128 * 0x10) & 7) == 2) goto LAB_00223e58;
      }
      local_128 = 0xff;
LAB_00223e58:
      *(char *)(puVar13 + 7) = (char)local_128;
      puVar10[6] = *(undefined8 *)(in_RDI + 0x40);
      *(undefined4 *)(in_RDI + 0x40) = 0;
      *(undefined4 *)(in_RDI + 0x44) = 0;
      if (local_630 != (CodeBuilder *)0x0) {
        in_stack_fffffffffffff758 = (CBNode *)(in_RDI + 0x98);
        in_stack_fffffffffffff760 = local_630;
        strlen((char *)local_630);
        iVar7 = Zone::dup((Zone *)in_stack_fffffffffffff758,(int)in_stack_fffffffffffff760);
        local_630 = (CodeBuilder *)CONCAT44(extraout_var_00,iVar7);
        puVar10[3] = local_630;
      }
      CodeBuilder::addNode(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
      local_5ec = 0;
    }
  }
  return local_5ec;
}

Assistant:

Error X86Compiler::_emit(uint32_t instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3, const Operand_& o4, const Operand_& o5) {
  uint32_t options = getOptions() | getGlobalOptions();
  const char* inlineComment = getInlineComment();

  uint32_t opCount = static_cast<uint32_t>(!o0.isNone()) +
                     static_cast<uint32_t>(!o1.isNone()) +
                     static_cast<uint32_t>(!o2.isNone()) +
                     static_cast<uint32_t>(!o3.isNone()) ;

  // Count 5th and 6th operands.
  if (!o4.isNone()) opCount = 5;
  if (!o5.isNone()) opCount = 6;

  // Handle failure and rare cases first.
  const uint32_t kErrorsAndSpecialCases = kOptionMaybeFailureCase | // CodeEmitter in error state.
                                          kOptionStrictValidation ; // Strict validation.

  if (ASMJIT_UNLIKELY(options & kErrorsAndSpecialCases)) {
    // Don't do anything if we are in error state.
    if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_VALIDATION)
    // Strict validation.
    if (options & kOptionStrictValidation) {
      Operand opArray[] = {
        Operand(o0),
        Operand(o1),
        Operand(o2),
        Operand(o3),
        Operand(o4),
        Operand(o5)
      };

      Inst::Detail instDetail(instId, options, _extraReg);
      Error err = Inst::validate(getArchType(), instDetail, opArray, opCount);

      if (err) {
#if !defined(ASMJIT_DISABLE_LOGGING)
        StringBuilderTmp<256> sb;
        sb.appendString(DebugUtils::errorAsString(err));
        sb.appendString(": ");
        Logging::formatInstruction(sb, 0, this, getArchType(), instDetail, opArray, opCount);
        return setLastError(err, sb.getData());
#else
        return setLastError(err);
#endif
      }

      // Clear it as it must be enabled explicitly on assembler side.
      options &= ~kOptionStrictValidation;
    }
#endif // ASMJIT_DISABLE_VALIDATION
  }

  resetOptions();
  resetInlineComment();

  // decide between `CBInst` and `CBJump`.
  if (isJumpInst(instId)) {
    CBJump* node = _cbHeap.allocT<CBJump>(sizeof(CBJump) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBJump));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);
    if (opCount > 4) opArray[4].copyFrom(o4);
    if (opCount > 5) opArray[5].copyFrom(o5);

    new(node) CBJump(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    CBLabel* jTarget = nullptr;
    if (!(options & kOptionUnfollow)) {
      if (opArray[0].isLabel()) {
        Error err = getCBLabel(&jTarget, static_cast<Label&>(opArray[0]));
        if (err) return setLastError(err);
      }
      else {
        options |= kOptionUnfollow;
      }
    }
    node->setOptions(options);

    node->orFlags(instId == X86Inst::kIdJmp ? CBNode::kFlagIsJmp | CBNode::kFlagIsTaken : CBNode::kFlagIsJcc);
    node->_target = jTarget;
    node->_jumpNext = nullptr;

    if (jTarget) {
      node->_jumpNext = static_cast<CBJump*>(jTarget->_from);
      jTarget->_from = node;
      jTarget->addNumRefs();
    }

    // The 'jmp' is always taken, conditional jump can contain hint, we detect it.
    if (instId == X86Inst::kIdJmp)
      node->orFlags(CBNode::kFlagIsTaken);
    else if (options & X86Inst::kOptionTaken)
      node->orFlags(CBNode::kFlagIsTaken);

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
  else {
    CBInst* node = _cbHeap.allocT<CBInst>(sizeof(CBInst) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBInst));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);
    if (opCount > 4) opArray[4].copyFrom(o4);
    if (opCount > 5) opArray[5].copyFrom(o5);

    node = new(node) CBInst(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
}